

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyph.cc
# Opt level: O0

bool woff2::StoreGlyph(Glyph *glyph,uint8_t *dst,size_t *dst_size)

{
  ulong uVar1;
  bool bVar2;
  short sVar3;
  size_type sVar4;
  long lVar5;
  size_t local_30;
  size_t offset;
  size_t *dst_size_local;
  uint8_t *dst_local;
  Glyph *glyph_local;
  
  local_30 = 0;
  offset = (size_t)dst_size;
  dst_size_local = (size_t *)dst;
  dst_local = (uint8_t *)glyph;
  if (glyph->composite_data_size == 0) {
    sVar4 = std::
            vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
            ::size(&glyph->contours);
    if (sVar4 != 0) {
      sVar4 = std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::size((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                      *)(dst_local + 0x18));
      sVar3 = std::numeric_limits<short>::max();
      if ((ulong)(long)sVar3 < sVar4) {
        return false;
      }
      uVar1 = *(ulong *)offset;
      sVar4 = std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::size((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                      *)(dst_local + 0x18));
      if (uVar1 < sVar4 * 2 + 0xc + (ulong)*(ushort *)(dst_local + 8)) {
        return false;
      }
      sVar4 = std::
              vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
              ::size((vector<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>,_std::allocator<std::vector<woff2::Glyph::Point,_std::allocator<woff2::Glyph::Point>_>_>_>
                      *)(dst_local + 0x18));
      Store16((int)sVar4,&local_30,(uint8_t *)dst_size_local);
      anon_unknown_6::StoreBbox((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local);
      bVar2 = anon_unknown_6::StoreEndPtsOfContours
                        ((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local);
      if (!bVar2) {
        return false;
      }
      anon_unknown_6::StoreInstructions((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local);
      bVar2 = anon_unknown_6::StorePoints
                        ((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local,*(size_t *)offset);
      if (!bVar2) {
        return false;
      }
    }
  }
  else {
    lVar5 = 0;
    if ((glyph->have_instructions & 1U) != 0) {
      lVar5 = 2;
    }
    if (*dst_size < (ulong)glyph->composite_data_size + 10 + lVar5 + (ulong)glyph->instructions_size
       ) {
      return false;
    }
    Store16(-1,&local_30,dst);
    anon_unknown_6::StoreBbox((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local);
    StoreBytes(*(uint8_t **)(dst_local + 0x30),(ulong)*(uint *)(dst_local + 0x38),&local_30,
               (uint8_t *)dst_size_local);
    if ((dst_local[0x3c] & 1) != 0) {
      anon_unknown_6::StoreInstructions((Glyph *)dst_local,&local_30,(uint8_t *)dst_size_local);
    }
  }
  *(size_t *)offset = local_30;
  return true;
}

Assistant:

bool StoreGlyph(const Glyph& glyph, uint8_t* dst, size_t* dst_size) {
  size_t offset = 0;
  if (glyph.composite_data_size > 0) {
    // Composite glyph.
    if (*dst_size < ((10ULL + glyph.composite_data_size) +
                     ((glyph.have_instructions ? 2ULL : 0) +
                      glyph.instructions_size))) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(-1, &offset, dst);
    StoreBbox(glyph, &offset, dst);
    StoreBytes(glyph.composite_data, glyph.composite_data_size, &offset, dst);
    if (glyph.have_instructions) {
      StoreInstructions(glyph, &offset, dst);
    }
  } else if (glyph.contours.size() > 0) {
    // Simple glyph.
    if (glyph.contours.size() > std::numeric_limits<int16_t>::max()) {
      return FONT_COMPRESSION_FAILURE();
    }
    if (*dst_size < ((12ULL + 2 * glyph.contours.size()) +
                     glyph.instructions_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
    Store16(glyph.contours.size(), &offset, dst);
    StoreBbox(glyph, &offset, dst);
    if (!StoreEndPtsOfContours(glyph, &offset, dst)) {
      return FONT_COMPRESSION_FAILURE();
    }
    StoreInstructions(glyph, &offset, dst);
    if (!StorePoints(glyph, &offset, dst, *dst_size)) {
      return FONT_COMPRESSION_FAILURE();
    }
  }
  *dst_size = offset;
  return true;
}